

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

void __thiscall
pbrt::DigitPermutation::DigitPermutation
          (DigitPermutation *this,int base,uint32_t seed,Allocator alloc)

{
  int iVar1;
  unsigned_short *puVar2;
  uint64_t uVar3;
  int iVar4;
  int digitValue;
  ulong uVar5;
  long lVar6;
  float fVar7;
  int vb;
  int va;
  long local_50;
  ulong local_48;
  long local_40;
  Allocator alloc_local;
  
  this->base = base;
  vb = 0x10000;
  va = base;
  alloc_local = alloc;
  if (base < 0x10000) {
    this->nDigits = 0;
    iVar1 = 0;
    iVar4 = 1;
    for (fVar7 = 1.0; 1.0 - fVar7 < 1.0; fVar7 = (1.0 / (float)base) * fVar7) {
      this->nDigits = iVar4;
      iVar1 = iVar1 + base;
      iVar4 = iVar4 + 1;
    }
    puVar2 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<unsigned_short>
                       (&alloc_local,(long)iVar1);
    this->permutations = puVar2;
    local_48 = (ulong)(uint)(base << 8);
    lVar6 = 0;
    local_50 = (long)base * 2;
    for (local_40 = 0; local_40 < this->nDigits; local_40 = local_40 + 1) {
      uVar3 = MixBits((ulong)((int)local_48 + (int)local_40 ^ seed));
      for (uVar5 = 0; (uint)(~(base >> 0x1f) & base) != uVar5; uVar5 = uVar5 + 1) {
        iVar4 = PermutationElement((uint32_t)uVar5,base,(uint32_t)uVar3);
        *(short *)((long)this->permutations + uVar5 * 2 + lVar6) = (short)iVar4;
      }
      lVar6 = lVar6 + local_50;
    }
    return;
  }
  LogFatal<char_const(&)[5],char_const(&)[6],char_const(&)[5],int&,char_const(&)[6],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/lowdiscrepancy.h"
             ,0x1e,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [5])0x3b1113,
             (char (*) [6])"65536",(char (*) [5])0x3b1113,&va,(char (*) [6])"65536",&vb);
}

Assistant:

DigitPermutation(int base, uint32_t seed, Allocator alloc) : base(base) {
        CHECK_LT(base, 65536);  // uint16_t
        // Compute number of digits needed for _base_
        nDigits = 0;
        Float invBase = (Float)1 / (Float)base, invBaseN = 1;
        while (1 - invBaseN < 1) {
            ++nDigits;
            invBaseN *= invBase;
        }

        permutations = alloc.allocate_object<uint16_t>(nDigits * base);
        for (int digitIndex = 0; digitIndex < nDigits; ++digitIndex) {
            // Compute random permutation for _digitIndex_
            uint32_t digitSeed = MixBits(((base << 8) + digitIndex) ^ seed);
            for (int digitValue = 0; digitValue < base; ++digitValue) {
                int index = digitIndex * base + digitValue;
                permutations[index] = PermutationElement(digitValue, base, digitSeed);
            }
        }
    }